

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v4.cpp
# Opt level: O3

int __thiscall
LASreadItemCompressed_BYTE14_v4::init(LASreadItemCompressed_BYTE14_v4 *this,EVP_PKEY_CTX *ctx)

{
  U32 UVar1;
  uint uVar2;
  ByteStreamIn *pBVar3;
  U8 *pUVar4;
  ByteStreamInArray **ppBVar5;
  ByteStreamInArray *pBVar6;
  ArithmeticDecoder **ppAVar7;
  ArithmeticDecoder *this_00;
  long lVar8;
  undefined7 extraout_var;
  U32 *in_RDX;
  BOOL BVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  
  pBVar3 = this->dec->instream;
  uVar11 = this->number;
  uVar13 = (ulong)uVar11;
  if (this->instream_Bytes == (ByteStreamInArray **)0x0) {
    uVar12 = uVar13 * 8;
    ppBVar5 = (ByteStreamInArray **)operator_new__(uVar12);
    this->instream_Bytes = ppBVar5;
    if (uVar11 == 0) {
      ppAVar7 = (ArithmeticDecoder **)operator_new__(uVar12);
      this->dec_Bytes = ppAVar7;
      goto LAB_0012ee79;
    }
    uVar10 = 0;
    do {
      pBVar6 = (ByteStreamInArray *)operator_new(0x38);
      (pBVar6->super_ByteStreamIn).bit_buffer = 0;
      (pBVar6->super_ByteStreamIn).num_buffer = 0;
      pBVar6->data = (U8 *)0x0;
      pBVar6->size = 0;
      pBVar6->curr = 0;
      pBVar6[1].super_ByteStreamIn._vptr_ByteStreamIn = (_func_int **)0x0;
      (pBVar6->super_ByteStreamIn)._vptr_ByteStreamIn = (_func_int **)&PTR_getByte_0015cc18;
      this->instream_Bytes[uVar10] = pBVar6;
      uVar10 = uVar10 + 1;
    } while (uVar13 != uVar10);
    ppAVar7 = (ArithmeticDecoder **)operator_new__(uVar12);
    this->dec_Bytes = ppAVar7;
    if (uVar11 == 0) goto LAB_0012ee79;
    uVar12 = 0;
    do {
      this_00 = (ArithmeticDecoder *)operator_new(0x10);
      ArithmeticDecoder::ArithmeticDecoder(this_00);
      this->dec_Bytes[uVar12] = this_00;
      uVar12 = uVar12 + 1;
      uVar13 = (ulong)this->number;
    } while (uVar12 < uVar13);
  }
  if ((int)uVar13 != 0) {
    uVar12 = 0;
    uVar11 = 0;
    do {
      if (this->requested_Bytes[uVar12] == true) {
        uVar11 = uVar11 + this->num_bytes_Bytes[uVar12];
      }
      uVar12 = uVar12 + 1;
    } while (uVar13 != uVar12);
    if (this->num_bytes_allocated < uVar11) {
      if (this->bytes == (U8 *)0x0) {
        pUVar4 = (U8 *)operator_new__((ulong)uVar11);
        this->bytes = pUVar4;
        this->num_bytes_allocated = uVar11;
      }
      else {
        operator_delete__(this->bytes);
        UVar1 = this->number;
        pUVar4 = (U8 *)operator_new__((ulong)uVar11);
        this->bytes = pUVar4;
        this->num_bytes_allocated = uVar11;
        if (UVar1 == 0) goto LAB_0012ee79;
      }
    }
    uVar13 = 0;
    uVar11 = 0;
    do {
      if (this->requested_Bytes[uVar13] == true) {
        if (this->num_bytes_Bytes[uVar13] == 0) {
          BVar9 = false;
          ArithmeticDecoder::init(this->dec_Bytes[uVar13],(EVP_PKEY_CTX *)0x0);
        }
        else {
          (*pBVar3->_vptr_ByteStreamIn[1])(pBVar3,this->bytes + uVar11);
          ppBVar5 = this->instream_Bytes;
          pBVar6 = ppBVar5[uVar13];
          pUVar4 = this->bytes;
          uVar2 = this->num_bytes_Bytes[uVar13];
          pBVar6->curr = 0;
          if (pUVar4 == (U8 *)0x0) {
            pBVar6->data = (U8 *)0x0;
            pBVar6->size = 0;
            ppBVar5 = this->instream_Bytes;
          }
          else {
            pBVar6->data = pUVar4 + uVar11;
            pBVar6->size = (ulong)uVar2;
          }
          ArithmeticDecoder::init(this->dec_Bytes[uVar13],(EVP_PKEY_CTX *)ppBVar5[uVar13]);
          uVar11 = uVar11 + this->num_bytes_Bytes[uVar13];
          BVar9 = true;
        }
      }
      else {
        if (this->num_bytes_Bytes[uVar13] != 0) {
          (*pBVar3->_vptr_ByteStreamIn[0xc])(pBVar3);
        }
        BVar9 = false;
      }
      this->changed_Bytes[uVar13] = BVar9;
      uVar13 = uVar13 + 1;
    } while (uVar13 < this->number);
  }
LAB_0012ee79:
  lVar8 = 0x48;
  do {
    *(undefined1 *)
     ((long)&(((LASreadItemCompressed_BYTE14_v4 *)(this->contexts + -3))->
             super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem + lVar8) = 1;
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0xa8);
  UVar1 = *in_RDX;
  this->current_context = UVar1;
  createAndInitModelsAndDecompressors(this,UVar1,(U8 *)ctx);
  return (int)CONCAT71(extraout_var,1);
}

Assistant:

BOOL LASreadItemCompressed_BYTE14_v4::init(const U8* item, U32& context)
{
  U32 i;

  /* for layered compression 'dec' only hands over the stream */

  ByteStreamIn* instream = dec->getByteStreamIn();

  /* on the first init create instreams and decoders */

  if (instream_Bytes == 0)
  {
    /* create instream pointer array */

    instream_Bytes = new ByteStreamInArray*[number];

    /* create instreams */

    if (IS_LITTLE_ENDIAN())
    {
      for (i = 0; i < number; i++)
      {
        instream_Bytes[i] = new ByteStreamInArrayLE();
      }
    }
    else
    {
      for (i = 0; i < number; i++)
      {
        instream_Bytes[i] = new ByteStreamInArrayBE();
      }
    }

    /* create decoder pointer array */

    dec_Bytes = new ArithmeticDecoder*[number];

    /* create layer decoders */

    for (i = 0; i < number; i++)
    {
      dec_Bytes[i] = new ArithmeticDecoder();
    }
  }

  /* how many bytes do we need to read */

  U32 num_bytes = 0;

  for (i = 0; i < number; i++)
  {
    if (requested_Bytes[i]) num_bytes += num_bytes_Bytes[i];
  }

  /* make sure the buffer is sufficiently large */

  if (num_bytes > num_bytes_allocated)
  {
    if (bytes) delete [] bytes;
    bytes = new U8[num_bytes];
    if (bytes == 0) return FALSE;
    num_bytes_allocated = num_bytes;
  }

  /* load the requested bytes and init the corresponding instreams an decoders */

  num_bytes = 0;
  for (i = 0; i < number; i++)
  {
    if (requested_Bytes[i])
    {
      if (num_bytes_Bytes[i])
      {
        instream->getBytes(&(bytes[num_bytes]), num_bytes_Bytes[i]);
        instream_Bytes[i]->init(&(bytes[num_bytes]), num_bytes_Bytes[i]);
        dec_Bytes[i]->init(instream_Bytes[i]);
        num_bytes += num_bytes_Bytes[i];
        changed_Bytes[i] = TRUE;
      }
      else
      {
        dec_Bytes[i]->init(0, 0);
        changed_Bytes[i] = FALSE;
      }
    }
    else
    {
      if (num_bytes_Bytes[i])
      {
        instream->skipBytes(num_bytes_Bytes[i]);
      }
      changed_Bytes[i] = FALSE;
    }
  }

  /* mark the four scanner channel contexts as unused */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    contexts[c].unused = TRUE;
  }

  /* set scanner channel as current context */

  current_context = context; // all other items use context set by POINT14 reader

  /* create and init models and decompressors */

  createAndInitModelsAndDecompressors(current_context, item);

  return TRUE;
}